

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc64ad.c
# Opt level: O2

int_t mc64ud_(int_t *id,int_t *mod,int_t *n,int_t *irn,int_t *lirn,int_t *ip,int_t *lenc,int_t *fc,
             int_t *iperm,int_t *num,int_t *numx,int_t *pr,int_t *arp,int_t *cv,int_t *out)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  int_t *piVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  ulong unaff_R14;
  int iVar19;
  long lVar20;
  bool bVar21;
  uint local_80;
  uint local_7c;
  
  if (*id == 1) {
    uVar11 = 0;
    uVar9 = (ulong)(uint)*n;
    if (*n < 1) {
      uVar9 = uVar11;
    }
    mod = (int_t *)(ulong)((int)uVar9 + 1);
    for (; uVar9 != uVar11; uVar11 = uVar11 + 1) {
      cv[uVar11] = 0;
      arp[uVar11] = 0;
    }
    uVar12 = *n;
    local_80 = uVar12;
    local_7c = uVar12;
  }
  else {
    uVar12 = *n;
    if (*mod == 1) {
      uVar11 = 0;
      uVar9 = (ulong)uVar12;
      if ((int)uVar12 < 1) {
        uVar9 = uVar11;
      }
      mod = (int_t *)(ulong)((int)uVar9 + 1);
      for (; uVar9 != uVar11; uVar11 = uVar11 + 1) {
        arp[uVar11] = 0;
      }
      uVar12 = *n;
    }
    local_7c = *numx;
    local_80 = uVar12 - local_7c;
  }
  iVar7 = *num;
  iVar14 = *id;
  lVar4 = (long)iVar7;
  lVar15 = lVar4;
  iVar2 = iVar7;
  uVar3 = 0;
LAB_00114290:
  do {
    iVar2 = iVar2 + 1;
    iVar5 = 0;
    if (0 < iVar2) {
      iVar5 = iVar2;
    }
    iVar7 = iVar7 + 1;
    iVar8 = 0;
    if (0 < iVar7) {
      iVar8 = iVar7;
    }
    if ((int)uVar12 <= lVar15) {
      iVar7 = *n;
      iVar14 = iVar7;
      goto LAB_00114536;
    }
    lVar15 = lVar15 + 1;
    uVar9 = (ulong)fc[(lVar15 - lVar4) + -1];
    pr[uVar9 - 1] = -1;
    iVar16 = (iVar14 + -1) * uVar12 + (int)lVar15;
    iVar10 = 1;
    while( true ) {
      iVar17 = (int)uVar9;
      if (iVar10 == iVar8 + 1) break;
      iVar13 = lenc[(long)iVar17 + -1];
      if (arp[(long)iVar17 + -1] < iVar13) {
        for (unaff_R14 = (ulong)(arp[(long)iVar17 + -1] + ip[(long)iVar17 + -1]);
            (long)unaff_R14 < (long)(ip[(long)iVar17 + -1] + iVar13); unaff_R14 = unaff_R14 + 1) {
          mod = (int_t *)(ulong)(uint)irn[unaff_R14 - 1];
          lVar20 = (long)irn[unaff_R14 - 1];
          if (iperm[lVar20 + -1] == 0) goto LAB_00114453;
        }
        arp[(long)iVar17 + -1] = iVar13;
        iVar13 = lenc[(long)iVar17 + -1];
      }
      out[(long)iVar17 + -1] = iVar13 + -1;
      iVar17 = 1;
      while (uVar11 = uVar9 & 0xffffffff, iVar17 != iVar8 + 1) {
        iVar13 = (int)uVar9;
        uVar18 = out[(long)iVar13 + -1];
        if (-1 < (int)uVar18) {
          iVar19 = ip[(long)iVar13 + -1] + lenc[(long)iVar13 + -1];
          uVar9 = (ulong)(int)(~uVar18 + iVar19);
          uVar11 = (ulong)iVar19;
          unaff_R14 = uVar9;
          if ((long)uVar9 < (long)uVar11) {
            unaff_R14 = uVar11;
          }
          for (; (long)uVar9 < (long)uVar11; uVar9 = uVar9 + 1) {
            uVar1 = irn[uVar9 - 1];
            mod = (int_t *)(ulong)uVar1;
            if (cv[(long)(int)uVar1 + -1] != iVar16) {
              unaff_R14 = (ulong)(~uVar18 + iVar19);
              uVar11 = (ulong)iperm[(long)(int)uVar1 + -1];
              cv[(long)(int)uVar1 + -1] = iVar16;
              pr[uVar11 - 1] = iVar13;
              out[(long)iVar13 + -1] = uVar18 - 1;
              goto LAB_00114440;
            }
            uVar18 = uVar18 - 1;
          }
        }
        uVar9 = (ulong)(uint)pr[(long)iVar13 + -1];
        iVar17 = iVar17 + 1;
        if (pr[(long)iVar13 + -1] == 0xffffffff) {
          uVar18 = uVar3 + 1;
          fc[uVar3] = iVar13;
          bVar21 = (int)local_80 <= (int)uVar3;
          iVar2 = iVar7;
          uVar3 = uVar18;
          if (bVar21) goto LAB_0011452d;
          goto LAB_00114290;
        }
      }
LAB_00114440:
      iVar10 = iVar10 + 1;
      uVar9 = uVar11 & 0xffffffff;
    }
    lVar20 = (long)(int)mod;
LAB_00114453:
    iperm[lVar20 + -1] = iVar17;
    arp[(long)iVar17 + -1] = ((int)unaff_R14 - ip[(long)iVar17 + -1]) + 1;
    *num = *num + 1;
    while (bVar21 = iVar5 != 0, iVar5 = iVar5 + -1, bVar21) {
      iVar8 = (int)uVar9;
      uVar9 = (ulong)pr[(long)iVar8 + -1];
      if (uVar9 == 0xffffffffffffffff) break;
      uVar18 = ((ip[uVar9 - 1] + lenc[uVar9 - 1]) - out[uVar9 - 1]) - 2;
      unaff_R14 = (ulong)uVar18;
      mod = (int_t *)(long)irn[(long)(int)uVar18 + -1];
      iperm[(long)mod + -1] = pr[(long)iVar8 + -1];
    }
    uVar18 = uVar3;
  } while (*num != local_7c);
LAB_0011452d:
  iVar7 = *n;
  uVar3 = uVar18;
  iVar14 = (int)lVar15;
LAB_00114536:
  piVar6 = fc + (int)uVar3;
  for (lVar15 = (long)iVar14; lVar15 < iVar7; lVar15 = lVar15 + 1) {
    *piVar6 = fc[lVar15 - lVar4];
    piVar6 = piVar6 + 1;
  }
  return 0;
}

Assistant:

int_t mc64ud_(int_t *id, int_t *mod, int_t *n, int_t *
	irn, int_t *lirn, int_t *ip, int_t *lenc, int_t *fc, int_t *
	iperm, int_t *num, int_t *numx, int_t *pr, int_t *arp, 
	int_t *cv, int_t *out)
{
    /* System generated locals */
    int_t i__1, i__2, i__3, i__4;

    /* Local variables */
    int_t i__, j, k, j1, ii, kk, id0, id1, in1, in2, nfc, num0, num1, num2, 
	    jord, last;


/* *** Copyright (c) 1999  Council for the Central Laboratory of the */
/*     Research Councils                                             *** */
/* *** Although every effort has been made to ensure robustness and  *** */
/* *** reliability of the subroutines in this MC64 suite, we         *** */
/* *** disclaim any liability arising through the use or misuse of   *** */
/* *** any of the subroutines.                                       *** */
/* *** Any problems?   Contact ... */
/*     Iain Duff (I.Duff@rl.ac.uk) or Jacko Koster (jak@ii.uib.no)   *** */

/* PR(J) is the previous column to J in the depth first search. */
/*   Array PR is used as workspace in the sorting algorithm. */
/* Elements (I,IPERM(I)) I=1,..,N are entries at the end of the */
/*   algorithm unless N assignments have not been made in which case */
/*   N-NUM pairs (I,IPERM(I)) will not be entries in the matrix. */
/* CV(I) is the most recent loop number (ID+JORD) at which row I */
/*   was visited. */
/* ARP(J) is the number of entries in column J which have been scanned */
/*   when looking for a cheap assignment. */
/* OUT(J) is one less than the number of entries in column J which have */
/*   not been scanned during one pass through the main loop. */
/* NUMX is maximum possible size of matching. */
    /* Parameter adjustments */
    --out;
    --cv;
    --arp;
    --pr;
    --iperm;
    --fc;
    --lenc;
    --ip;
    --irn;

    /* Function Body */
    if (*id == 1) {
/* The first call to MC64U/UD. */
/* Initialize CV and ARP; parameters MOD, NUMX are not accessed */
	i__1 = *n;
	for (i__ = 1; i__ <= i__1; ++i__) {
	    cv[i__] = 0;
	    arp[i__] = 0;
/* L5: */
	}
	num1 = *n;
	num2 = *n;
    } else {
/* Not the first call to MC64U/UD. */
/* Re-initialize ARP if entries were deleted since last call to MC64U/UD */
	if (*mod == 1) {
	    i__1 = *n;
	    for (i__ = 1; i__ <= i__1; ++i__) {
		arp[i__] = 0;
/* L8: */
	    }
	}
	num1 = *numx;
	num2 = *n - *numx;
    }
    num0 = *num;
/* NUM0 is size of input matching */
/* NUM1 is maximum possible size of matching */
/* NUM2 is maximum allowed number of unassigned rows/columns */
/* NUM is size of current matching */
/* Quick return if possible */
/*      IF (NUM.EQ.N) GO TO 199 */
/* NFC is number of rows/columns that could not be assigned */
    nfc = 0;
/* Integers ID0+1 to ID0+N are unique numbers for call ID to MC64U/UD, */
/* so 1st call uses 1..N, 2nd call uses N+1..2N, etc */
    id0 = (*id - 1) * *n;
/* Main loop. Each pass round this loop either results in a new */
/* assignment or gives a column with no assignment */
    i__1 = *n;
    for (jord = num0 + 1; jord <= i__1; ++jord) {
/* Each pass uses unique number ID1 */
	id1 = id0 + jord;
/* J is unmatched column */
	j = fc[jord - num0];
	pr[j] = -1;
	i__2 = jord;
	for (k = 1; k <= i__2; ++k) {
/* Look for a cheap assignment */
	    if (arp[j] >= lenc[j]) {
		goto L30;
	    }
	    in1 = ip[j] + arp[j];
	    in2 = ip[j] + lenc[j] - 1;
	    i__3 = in2;
	    for (ii = in1; ii <= i__3; ++ii) {
		i__ = irn[ii];
		if (iperm[i__] == 0) {
		    goto L80;
		}
/* L20: */
	    }
/* No cheap assignment in row */
	    arp[j] = lenc[j];
/* Begin looking for assignment chain starting with row J */
L30:
	    out[j] = lenc[j] - 1;
/* Inner loop.  Extends chain by one or backtracks */
	    i__3 = jord;
	    for (kk = 1; kk <= i__3; ++kk) {
		in1 = out[j];
		if (in1 < 0) {
		    goto L50;
		}
		in2 = ip[j] + lenc[j] - 1;
		in1 = in2 - in1;
/* Forward scan */
		i__4 = in2;
		for (ii = in1; ii <= i__4; ++ii) {
		    i__ = irn[ii];
		    if (cv[i__] == id1) {
			goto L40;
		    }
/* Column J has not yet been accessed during this pass */
		    j1 = j;
		    j = iperm[i__];
		    cv[i__] = id1;
		    pr[j] = j1;
		    out[j1] = in2 - ii - 1;
		    goto L70;
L40:
		    ;
		}
/* Backtracking step. */
L50:
		j1 = pr[j];
		if (j1 == -1) {
/* No augmenting path exists for column J. */
		    ++nfc;
		    fc[nfc] = j;
		    if (nfc > num2) {
/* A matching of maximum size NUM1 is not possible */
			last = jord;
			goto L101;
		    }
		    goto L100;
		}
		j = j1;
/* L60: */
	    }
/* End of dummy loop; this point is never reached */
L70:
	    ;
	}
/* End of dummy loop; this point is never reached */
/* New assignment is made. */
L80:
	iperm[i__] = j;
	arp[j] = ii - ip[j] + 1;
	++(*num);
	i__2 = jord;
	for (k = 1; k <= i__2; ++k) {
	    j = pr[j];
	    if (j == -1) {
		goto L95;
	    }
	    ii = ip[j] + lenc[j] - out[j] - 2;
	    i__ = irn[ii];
	    iperm[i__] = j;
/* L90: */
	}
/* End of dummy loop; this point is never reached */
L95:
	if (*num == num1) {
/* A matching of maximum size NUM1 is found */
	    last = jord;
	    goto L101;
	}

L100:
	;
    }
/* All unassigned columns have been considered */
    last = *n;
/* Now, a transversal is computed or is not possible. */
/* Complete FC before returning. */
L101:
    i__1 = *n;
    for (jord = last + 1; jord <= i__1; ++jord) {
	++nfc;
	fc[nfc] = fc[jord - num0];
/* L110: */
    }
/*  199 RETURN */
    return 0;
}